

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::BuildIntersectList(Clipper *this,long64 botY,long64 topY)

{
  TEdge *edge;
  bool bVar1;
  long64 lVar2;
  bool bVar3;
  undefined1 local_48 [8];
  IntPoint pt;
  TEdge *eNext;
  TEdge *pTStack_28;
  bool isModified;
  TEdge *e;
  long64 topY_local;
  long64 botY_local;
  Clipper *this_local;
  
  if (this->m_ActiveEdges != (TEdge *)0x0) {
    edge = this->m_ActiveEdges;
    lVar2 = TopX(edge,topY);
    edge->tmpX = lVar2;
    this->m_SortedEdges = edge;
    this->m_SortedEdges->prevInSEL = (TEdge *)0x0;
    for (pTStack_28 = edge->nextInAEL; pTStack_28 != (TEdge *)0x0;
        pTStack_28 = pTStack_28->nextInAEL) {
      pTStack_28->prevInSEL = pTStack_28->prevInAEL;
      pTStack_28->prevInSEL->nextInSEL = pTStack_28;
      pTStack_28->nextInSEL = (TEdge *)0x0;
      lVar2 = TopX(pTStack_28,topY);
      pTStack_28->tmpX = lVar2;
    }
    bVar1 = true;
    while( true ) {
      bVar3 = false;
      if (bVar1) {
        bVar3 = this->m_SortedEdges != (TEdge *)0x0;
      }
      if (!bVar3) break;
      bVar1 = false;
      pTStack_28 = this->m_SortedEdges;
      while (pTStack_28->nextInSEL != (TEdge *)0x0) {
        pt.Y = (long64)pTStack_28->nextInSEL;
        IntPoint::IntPoint((IntPoint *)local_48,0,0);
        if ((*(long *)(pt.Y + 0x38) < pTStack_28->tmpX) &&
           (bVar3 = IntersectPoint(pTStack_28,(TEdge *)pt.Y,(IntPoint *)local_48,
                                   (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                                [(long)&(this->m_PolyOuts).
                                                                                                                
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                ] & 1)), bVar3)) {
          if (botY < pt.X) {
            pt.X = botY;
            local_48 = (undefined1  [8])TopX(pTStack_28,botY);
          }
          AddIntersectNode(this,pTStack_28,(TEdge *)pt.Y,(IntPoint *)local_48);
          SwapPositionsInSEL(this,pTStack_28,(TEdge *)pt.Y);
          bVar1 = true;
        }
        else {
          pTStack_28 = (TEdge *)pt.Y;
        }
      }
      if (pTStack_28->prevInSEL == (TEdge *)0x0) break;
      pTStack_28->prevInSEL->nextInSEL = (TEdge *)0x0;
    }
    this->m_SortedEdges = (TEdge *)0x0;
  }
  return;
}

Assistant:

void Clipper::BuildIntersectList(const long64 botY, const long64 topY)
{
  if ( !m_ActiveEdges ) return;

  //prepare for sorting ...
  TEdge* e = m_ActiveEdges;
  e->tmpX = TopX( *e, topY );
  m_SortedEdges = e;
  m_SortedEdges->prevInSEL = 0;
  e = e->nextInAEL;
  while( e )
  {
    e->prevInSEL = e->prevInAEL;
    e->prevInSEL->nextInSEL = e;
    e->nextInSEL = 0;
    e->tmpX = TopX( *e, topY );
    e = e->nextInAEL;
  }

  //bubblesort ...
  bool isModified = true;
  while( isModified && m_SortedEdges )
  {
    isModified = false;
    e = m_SortedEdges;
    while( e->nextInSEL )
    {
      TEdge *eNext = e->nextInSEL;
      IntPoint pt;
      if(e->tmpX > eNext->tmpX &&
        IntersectPoint(*e, *eNext, pt, m_UseFullRange))
      {
        if (pt.Y > botY)
        {
            pt.Y = botY;
            pt.X = TopX(*e, pt.Y);
        }
        AddIntersectNode( e, eNext, pt );
        SwapPositionsInSEL(e, eNext);
        isModified = true;
      }
      else
        e = eNext;
    }
    if( e->prevInSEL ) e->prevInSEL->nextInSEL = 0;
    else break;
  }
  m_SortedEdges = 0;
}